

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::FieldOptions::InternalSerializeWithCachedSizesToArray
          (FieldOptions *this,bool deterministic,uint8 *target)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  Type *this_00;
  uint8 *puVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int index;
  
  uVar7 = (this->_has_bits_).has_bits_[0];
  if ((uVar7 & 1) != 0) {
    uVar8 = (ulong)this->ctype_;
    pbVar6 = target + 1;
    *target = '\b';
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar3);
    }
    *pbVar6 = (byte)uVar9;
    target = pbVar6 + 1;
  }
  if ((uVar7 & 2) != 0) {
    bVar3 = this->packed_;
    *target = 0x10;
    target[1] = bVar3;
    target = target + 2;
  }
  if ((uVar7 & 8) != 0) {
    bVar3 = this->deprecated_;
    *target = 0x18;
    target[1] = bVar3;
    target = target + 2;
  }
  if ((uVar7 & 4) != 0) {
    bVar3 = this->lazy_;
    *target = 0x28;
    target[1] = bVar3;
    target = target + 2;
  }
  if ((uVar7 & 0x20) != 0) {
    uVar8 = (ulong)this->jstype_;
    pbVar6 = target + 1;
    *target = 0x30;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar3);
    }
    *pbVar6 = (byte)uVar9;
    target = pbVar6 + 1;
  }
  if ((uVar7 & 0x10) != 0) {
    bVar3 = this->weak_;
    *target = 0x50;
    target[1] = bVar3;
    target = target + 2;
  }
  iVar1 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
      target[0] = 0xba;
      target[1] = 0x3e;
      pbVar6 = target + 2;
      uVar7 = this_00->_cached_size_;
      uVar5 = uVar7;
      if (0x7f < uVar7) {
        do {
          *pbVar6 = (byte)uVar7 | 0x80;
          uVar5 = uVar7 >> 7;
          pbVar6 = pbVar6 + 1;
          bVar3 = 0x3fff < uVar7;
          uVar7 = uVar5;
        } while (bVar3);
      }
      *pbVar6 = (byte)uVar5;
      target = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                         (this_00,false,pbVar6 + 1);
      index = index + 1;
    } while (index != iVar1);
  }
  puVar4 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,deterministic,target);
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),puVar4);
    return puVar4;
  }
  return puVar4;
}

Assistant:

::google::protobuf::uint8* FieldOptions::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->ctype(), target);
  }

  // optional bool packed = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->packed(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->deprecated(), target);
  }

  // optional bool lazy = 5 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(5, this->lazy(), target);
  }

  // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      6, this->jstype(), target);
  }

  // optional bool weak = 10 [default = false];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->weak(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), deterministic, target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, deterministic, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldOptions)
  return target;
}